

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

uint64_t absl::hash_internal::MixingHashState::CombineContiguousImpl
                   (uint64_t state,uint *first,size_t len)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  uint64_t uVar4;
  
  if (len < 9) {
    if (3 < len) {
      uVar3 = (ulong)*(uint *)((long)first + (len - 4)) << ((char)((int)len << 3) - 0x20U & 0x3f) |
              (ulong)*first;
      goto LAB_00126cfe;
    }
    if (len == 0) {
      return state;
    }
    uVar2 = Read1To3((uchar *)first,len);
  }
  else {
    if (0x400 < len) {
      uVar4 = CombineLargeContiguousImpl32(state,(uchar *)first,len);
      return uVar4;
    }
    uVar2 = CityHash32((char *)first,len);
  }
  uVar3 = (ulong)uVar2;
LAB_00126cfe:
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3 + state;
  return SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),8) ^
         SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),0);
}

Assistant:

inline uint64_t MixingHashState::CombineContiguousImpl(
    uint64_t state, const unsigned char* first, size_t len,
    std::integral_constant<int, 4> /* sizeof_size_t */) {
  // For large values we use CityHash, for small ones we just use a
  // multiplicative hash.
  uint64_t v;
  if (len > 8) {
    if (ABSL_PREDICT_FALSE(len > PiecewiseChunkSize())) {
      return CombineLargeContiguousImpl32(state, first, len);
    }
    v = hash_internal::CityHash32(reinterpret_cast<const char*>(first), len);
  } else if (len >= 4) {
    v = Read4To8(first, len);
  } else if (len > 0) {
    v = Read1To3(first, len);
  } else {
    // Empty ranges have no effect.
    return state;
  }
  return Mix(state, v);
}